

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O2

void __thiscall
t_cpp_generator::generate_exception_what_method
          (t_cpp_generator *this,ostream *out,t_struct *tstruct)

{
  int *piVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  t_cpp_generator *this_00;
  
  t_generator::indent_abi_cxx11_((string *)&stack0xffffffffffffffc0,(t_generator *)this);
  std::operator<<(out,(string *)&stack0xffffffffffffffc0);
  this_00 = (t_cpp_generator *)&stack0xffffffffffffffc0;
  std::__cxx11::string::~string((string *)this_00);
  generate_exception_what_method_decl(this_00,out,tstruct,true);
  poVar3 = std::operator<<(out," {");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_((string *)&stack0xffffffffffffffc0,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&stack0xffffffffffffffc0);
  poVar3 = std::operator<<(poVar3,"try {");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_((string *)&stack0xffffffffffffffc0,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&stack0xffffffffffffffc0);
  poVar3 = std::operator<<(poVar3,"std::stringstream ss;");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  t_generator::indent_abi_cxx11_((string *)&stack0xffffffffffffffc0,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&stack0xffffffffffffffc0);
  poVar3 = std::operator<<(poVar3,"ss << \"TException - service has thrown: \" << *this;");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  t_generator::indent_abi_cxx11_((string *)&stack0xffffffffffffffc0,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&stack0xffffffffffffffc0);
  poVar3 = std::operator<<(poVar3,"this->thriftTExceptionMessageHolder_ = ss.str();");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  t_generator::indent_abi_cxx11_((string *)&stack0xffffffffffffffc0,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&stack0xffffffffffffffc0);
  poVar3 = std::operator<<(poVar3,"return this->thriftTExceptionMessageHolder_.c_str();");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_((string *)&stack0xffffffffffffffc0,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&stack0xffffffffffffffc0);
  poVar3 = std::operator<<(poVar3,"} catch (const std::exception&) {");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_((string *)&stack0xffffffffffffffc0,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&stack0xffffffffffffffc0);
  poVar3 = std::operator<<(poVar3,"return \"TException - service has thrown: ");
  iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  poVar3 = std::operator<<(poVar3,(string *)CONCAT44(extraout_var,iVar2));
  poVar3 = std::operator<<(poVar3,"\";");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_((string *)&stack0xffffffffffffffc0,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&stack0xffffffffffffffc0);
  poVar3 = std::operator<<(poVar3,"}");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar3 = std::operator<<(out,"}");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_cpp_generator::generate_exception_what_method(std::ostream& out, t_struct* tstruct) {
  out << indent();
  generate_exception_what_method_decl(out, tstruct, true);
  out << " {" << endl;

  indent_up();
  out << indent() << "try {" << endl;

  indent_up();
  out << indent() << "std::stringstream ss;" << endl;
  out << indent() << "ss << \"TException - service has thrown: \" << *this;" << endl;
  out << indent() << "this->thriftTExceptionMessageHolder_ = ss.str();" << endl;
  out << indent() << "return this->thriftTExceptionMessageHolder_.c_str();" << endl;
  indent_down();

  out << indent() << "} catch (const std::exception&) {" << endl;

  indent_up();
  out << indent() << "return \"TException - service has thrown: " << tstruct->get_name() << "\";"
      << endl;
  indent_down();

  out << indent() << "}" << endl;

  indent_down();
  out << "}" << endl << endl;
}